

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_double_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_fe *rzr)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  
  secp256k1_gej_verify(a);
  if (a->infinity == 0) {
    if (rzr != (secp256k1_fe *)0x0) {
      uVar1 = (a->y).n[0];
      uVar2 = (a->y).n[1];
      uVar3 = (a->y).n[2];
      uVar4 = (a->y).n[3];
      iVar5 = (a->y).magnitude;
      iVar6 = (a->y).normalized;
      rzr->n[4] = (a->y).n[4];
      rzr->magnitude = iVar5;
      rzr->normalized = iVar6;
      rzr->n[2] = uVar3;
      rzr->n[3] = uVar4;
      rzr->n[0] = uVar1;
      rzr->n[1] = uVar2;
      secp256k1_fe_normalize_weak(rzr);
    }
    secp256k1_gej_double(r,a);
    secp256k1_gej_verify(r);
    return;
  }
  secp256k1_gej_set_infinity(r);
  if (rzr != (secp256k1_fe *)0x0) {
    secp256k1_fe_set_int(rzr,1);
    return;
  }
  return;
}

Assistant:

static void secp256k1_gej_double_var(secp256k1_gej *r, const secp256k1_gej *a, secp256k1_fe *rzr) {
    SECP256K1_GEJ_VERIFY(a);

    /** For secp256k1, 2Q is infinity if and only if Q is infinity. This is because if 2Q = infinity,
     *  Q must equal -Q, or that Q.y == -(Q.y), or Q.y is 0. For a point on y^2 = x^3 + 7 to have
     *  y=0, x^3 must be -7 mod p. However, -7 has no cube root mod p.
     *
     *  Having said this, if this function receives a point on a sextic twist, e.g. by
     *  a fault attack, it is possible for y to be 0. This happens for y^2 = x^3 + 6,
     *  since -6 does have a cube root mod p. For this point, this function will not set
     *  the infinity flag even though the point doubles to infinity, and the result
     *  point will be gibberish (z = 0 but infinity = 0).
     */
    if (a->infinity) {
        secp256k1_gej_set_infinity(r);
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        return;
    }

    if (rzr != NULL) {
        *rzr = a->y;
        secp256k1_fe_normalize_weak(rzr);
    }

    secp256k1_gej_double(r, a);

    SECP256K1_GEJ_VERIFY(r);
}